

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlDumpEnumeration(xmlBufferPtr buf,xmlEnumerationPtr cur)

{
  if (cur != (xmlEnumerationPtr)0x0) {
    do {
      xmlBufferWriteCHAR(buf,cur->name);
      if (cur->next == (_xmlEnumeration *)0x0) {
        xmlBufferWriteChar(buf,")");
        return;
      }
      xmlBufferWriteChar(buf," | ");
      cur = cur->next;
    } while (cur != (_xmlEnumeration *)0x0);
  }
  return;
}

Assistant:

static void
xmlDumpEnumeration(xmlBufferPtr buf, xmlEnumerationPtr cur) {
    if ((buf == NULL) || (cur == NULL))
        return;

    xmlBufferWriteCHAR(buf, cur->name);
    if (cur->next == NULL)
	xmlBufferWriteChar(buf, ")");
    else {
	xmlBufferWriteChar(buf, " | ");
	xmlDumpEnumeration(buf, cur->next);
    }
}